

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialSums.h
# Opt level: O0

void __thiscall
bwtil::PartialSums::incrementFrom
          (PartialSums *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *nodes,
          ulint node_nr,uint i)

{
  reference pvVar1;
  int in_ECX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  ulint MASK;
  ulong local_28;
  
  local_28 = 0xffffffffffffffff;
  if (in_ECX != 0) {
    local_28 = (1L << ((*(char *)((long)&(in_RDI->
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 3) -
                       (char)in_ECX) *
                       *(char *)((long)&(in_RDI->
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 2) & 0x3fU)) -
               1;
  }
  local_28 = local_28 &
             (ulong)(in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(in_RDI,local_28);
  *pvVar1 = local_28 + *pvVar1;
  return;
}

Assistant:

inline void incrementFrom(vector<ulint> * nodes, ulint node_nr, uint i){

	#ifdef DEBUG
		if(empty){
			cout << "ERROR (PartialSums): incrementFrom() called on empty counter\n";
			exit(0);
		}
	#endif

	#ifdef DEBUG
		if(i>d){
			cout << "ERROR (PartialSums): incrementing counter i>d (" << i << ">" << d << ")\n";
			exit(0);
		}
	#endif

		ulint MASK = ~((ulint)0);

		if(i>0) MASK = ((ulint)1<<((d-i)*log2n))-1;

		//printWord(MASK&ones);

		nodes->at(node_nr) += (MASK&ones);

	}